

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue val;
  int iVar1;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  uint uVar4;
  ulong uVar5;
  JSValueUnion JVar6;
  int64_t iVar7;
  int64_t *piVar8;
  JSValue this_obj;
  JSValue JVar9;
  JSValue prop;
  JSValue val_00;
  JSValue val_01;
  uint32_t len;
  uint local_34;
  
  this_obj = js_create_from_ctor(ctx,new_target,2);
  JVar2 = this_obj.u;
  if ((uint)this_obj.tag != 6) {
    if (argc == 1) {
      iVar7 = argv->tag;
      uVar4 = (uint)iVar7;
      if ((uVar4 == 7) || (uVar4 == 0)) {
        JVar6 = (JSValueUnion)(argv->u).ptr;
        if (0xfffffff4 < uVar4) {
          *(int *)JVar6.ptr = *JVar6.ptr + 1;
        }
        val_00.tag = iVar7;
        val_00.u.ptr = JVar6.ptr;
        iVar1 = JS_ToArrayLengthFree(ctx,&local_34,val_00,1);
        if (iVar1 == 0) {
          JVar3 = (JSValueUnion)(long)(int)local_34;
          JVar6.float64 = (double)local_34;
          if (-1 < (long)JVar3.ptr) {
            JVar6 = JVar3;
          }
          iVar7 = 7;
          if (-1 < (long)JVar3.ptr) {
            iVar7 = 0;
          }
          val_01.tag = iVar7;
          val_01.u.float64 = JVar6.float64;
          iVar1 = JS_SetPropertyInternal(ctx,this_obj,0x30,val_01,0x4000);
          if (-1 < iVar1) goto LAB_00132af9;
        }
LAB_00132b52:
        if ((0xfffffff4 < (uint)this_obj.tag) &&
           (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,this_obj);
        }
        this_obj = (JSValue)(ZEXT816(6) << 0x40);
        uVar5 = 0;
        goto LAB_00132b88;
      }
    }
    if (0 < argc) {
      piVar8 = &argv->tag;
      uVar5 = 0;
      do {
        JVar6 = (JSValueUnion)((JSValueUnion *)(piVar8 + -1))->ptr;
        iVar7 = *piVar8;
        if (0xfffffff4 < (uint)iVar7) {
          *(int *)JVar6.ptr = *JVar6.ptr + 1;
        }
        val.tag = iVar7;
        val.u.ptr = JVar6.ptr;
        prop.tag = 0;
        prop.u.ptr = (void *)uVar5;
        iVar1 = JS_SetPropertyValue(ctx,this_obj,prop,val,0x4000);
        if (iVar1 < 0) goto LAB_00132b52;
        uVar5 = uVar5 + 1;
        piVar8 = piVar8 + 2;
      } while ((uint)argc != uVar5);
    }
  }
LAB_00132af9:
  uVar5 = (ulong)JVar2.ptr & 0xffffffff00000000;
LAB_00132b88:
  JVar9.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar5);
  JVar9.tag = this_obj.tag;
  return JVar9;
}

Assistant:

static JSValue js_array_constructor(JSContext *ctx, JSValueConst new_target,
                                    int argc, JSValueConst *argv)
{
    JSValue obj;
    int i;

    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_ARRAY);
    if (JS_IsException(obj))
        return obj;
    if (argc == 1 && JS_IsNumber(argv[0])) {
        uint32_t len;
        if (JS_ToArrayLengthFree(ctx, &len, JS_DupValue(ctx, argv[0]), TRUE))
            goto fail;
        if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewUint32(ctx, len)) < 0)
            goto fail;
    } else {
        for(i = 0; i < argc; i++) {
            if (JS_SetPropertyUint32(ctx, obj, i, JS_DupValue(ctx, argv[i])) < 0)
                goto fail;
        }
    }
    return obj;
fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}